

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeExpression(ExpressionContext *ctx,SynBase *syntax)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  ExprError *pEVar4;
  undefined4 extraout_var;
  TypeBase *pTVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  
  uVar2 = ctx->expressionDepth + 1;
  ctx->expressionDepth = uVar2;
  if (0x800 < uVar2) {
    anon_unknown.dwarf_c6b42::Stop
              (ctx,syntax,"ERROR: reached maximum generic expression depth (%d)",0x800);
  }
  pEVar4 = (ExprError *)0x0;
  switch(syntax->typeID) {
  case 0:
    pEVar4 = (ExprError *)AnalyzeError(ctx,(SynError *)syntax);
    break;
  case 4:
    pEVar4 = (ExprError *)AnalyzeVariableAccess(ctx,(SynIdentifier *)syntax);
    break;
  case 5:
    pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar6 = "ERROR: cannot take typeid from auto type";
    goto LAB_00169eea;
  case 6:
    pcVar6 = "ERROR: cannot take typeid from generic type";
    goto LAB_00169fc5;
  case 7:
    pEVar4 = (ExprError *)AnalyzeTypeSimple(ctx,(SynTypeSimple *)syntax);
    break;
  case 8:
    pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pcVar6 = "ERROR: cannot take typeid from generic type";
LAB_00169eea:
    pEVar4 = anon_unknown.dwarf_c6b42::ReportExpected(ctx,syntax,pTVar5,pcVar6);
    break;
  case 9:
    pEVar4 = (ExprError *)AnalyzeTypeArray(ctx,(SynTypeArray *)syntax);
    break;
  case 10:
    pEVar4 = (ExprError *)AnalyzeTypeReference(ctx,(SynTypeReference *)syntax);
    break;
  case 0xb:
    pEVar4 = (ExprError *)AnalyzeTypeFunction(ctx,(SynTypeFunction *)syntax);
    break;
  case 0xc:
    pEVar4 = (ExprError *)AnalyzeTypeGenericInstance(ctx,(SynTypeGenericInstance *)syntax);
    break;
  case 0xd:
    pEVar4 = (ExprError *)AnalyzeTypeof(ctx,(SynTypeof *)syntax);
    break;
  case 0xe:
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar4 = (ExprError *)CONCAT44(extraout_var_00,iVar3);
    pTVar5 = ctx->typeBool;
    uVar1 = syntax->field_0x3a;
    (pEVar4->super_ExprBase).typeID = 3;
    (pEVar4->super_ExprBase).source = syntax;
    (pEVar4->super_ExprBase).type = pTVar5;
    (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar4->super_ExprBase).listed = false;
    (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
    (pEVar4->super_ExprBase).field_0x29 = uVar1;
    break;
  case 0xf:
    pEVar4 = (ExprError *)AnalyzeNumber(ctx,(SynNumber *)syntax);
    break;
  case 0x10:
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar4 = (ExprError *)CONCAT44(extraout_var,iVar3);
    pTVar5 = ctx->typeNullPtr;
    (pEVar4->super_ExprBase).typeID = 9;
    (pEVar4->super_ExprBase).source = syntax;
    (pEVar4->super_ExprBase).type = pTVar5;
    (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar4->super_ExprBase).listed = false;
    (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
    break;
  case 0x11:
    pEVar4 = (ExprError *)AnalyzeCharacter(ctx,(SynCharacter *)syntax);
    break;
  case 0x12:
    pEVar4 = (ExprError *)AnalyzeString(ctx,(SynString *)syntax);
    break;
  case 0x13:
    pEVar4 = (ExprError *)AnalyzeArray(ctx,(SynArray *)syntax);
    break;
  case 0x14:
    pEVar4 = (ExprError *)AnalyzeGenerator(ctx,(SynGenerator *)syntax);
    break;
  case 0x17:
    pEVar4 = (ExprError *)AnalyzeMemberAccess(ctx,(SynMemberAccess *)syntax);
    break;
  case 0x19:
    pEVar4 = (ExprError *)AnalyzeArrayIndex(ctx,(SynArrayIndex *)syntax);
    break;
  case 0x1a:
    pEVar4 = (ExprError *)AnalyzeFunctionCall(ctx,(SynFunctionCall *)syntax);
    break;
  case 0x1b:
    pEVar4 = (ExprError *)AnalyzePreModify(ctx,(SynPreModify *)syntax);
    break;
  case 0x1c:
    pEVar4 = (ExprError *)AnalyzePostModify(ctx,(SynPostModify *)syntax);
    break;
  case 0x1d:
    pEVar4 = (ExprError *)AnalyzeGetAddress(ctx,(SynGetAddress *)syntax);
    break;
  case 0x1e:
    pEVar4 = (ExprError *)AnalyzeDereference(ctx,(SynDereference *)syntax);
    break;
  case 0x1f:
    pEVar4 = (ExprError *)AnalyzeSizeof(ctx,(SynSizeof *)syntax);
    break;
  case 0x20:
    pEVar4 = (ExprError *)AnalyzeNew(ctx,(SynNew *)syntax);
    break;
  case 0x21:
    pEVar4 = (ExprError *)AnalyzeConditional(ctx,(SynConditional *)syntax);
    break;
  case 0x2f:
    pEVar4 = (ExprError *)AnalyzeUnaryOp(ctx,(SynUnaryOp *)syntax);
    break;
  case 0x30:
    pEVar4 = (ExprError *)AnalyzeBinaryOp(ctx,(SynBinaryOp *)syntax);
    break;
  case 0x31:
    pEVar4 = (ExprError *)AnalyzeAssignment(ctx,(SynAssignment *)syntax);
    break;
  case 0x32:
    pEVar4 = (ExprError *)AnalyzeModifyAssignment(ctx,(SynModifyAssignment *)syntax);
    break;
  case 0x37:
    pEVar4 = (ExprError *)
             AnalyzeFunctionDefinition
                       (ctx,(SynFunctionDefinition *)syntax,(FunctionData *)0x0,(TypeFunction *)0x0,
                        (TypeBase *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),true,true,true);
    break;
  case 0x39:
    pEVar4 = (ExprError *)AnalyzeShortFunctionDefinition(ctx,(SynShortFunctionDefinition *)syntax);
  }
  ctx->expressionDepth = ctx->expressionDepth - 1;
  if (pEVar4 != (ExprError *)0x0) {
    return &pEVar4->super_ExprBase;
  }
  pcVar6 = "ERROR: unknown expression type";
LAB_00169fc5:
  anon_unknown.dwarf_c6b42::Stop(ctx,syntax,pcVar6);
}

Assistant:

ExprBase* AnalyzeExpression(ExpressionContext &ctx, SynBase *syntax)
{
	ctx.expressionDepth++;

	if(ctx.expressionDepth > NULLC_MAX_EXPRESSION_DEPTH)
		Stop(ctx, syntax, "ERROR: reached maximum generic expression depth (%d)", NULLC_MAX_EXPRESSION_DEPTH);

	ExprBase *result = NULL;

	switch(syntax->typeID)
	{
	case SynBool::myTypeID:
		result = AnalyzeBool(ctx, (SynBool*)syntax);
		break;
	case SynCharacter::myTypeID:
		result = AnalyzeCharacter(ctx, (SynCharacter*)syntax);
		break;
	case SynString::myTypeID:
		result = AnalyzeString(ctx, (SynString*)syntax);
		break;
	case SynNullptr::myTypeID:
		result = AnalyzeNullptr(ctx, (SynNullptr*)syntax);
		break;
	case SynNumber::myTypeID:
		result = AnalyzeNumber(ctx, (SynNumber*)syntax);
		break;
	case SynArray::myTypeID:
		result = AnalyzeArray(ctx, (SynArray*)syntax);
		break;
	case SynPreModify::myTypeID:
		result = AnalyzePreModify(ctx, (SynPreModify*)syntax);
		break;
	case SynPostModify::myTypeID:
		result = AnalyzePostModify(ctx, (SynPostModify*)syntax);
		break;
	case SynUnaryOp::myTypeID:
		result = AnalyzeUnaryOp(ctx, (SynUnaryOp*)syntax);
		break;
	case SynBinaryOp::myTypeID:
		result = AnalyzeBinaryOp(ctx, (SynBinaryOp*)syntax);
		break;
	case SynGetAddress::myTypeID:
		result = AnalyzeGetAddress(ctx, (SynGetAddress*)syntax);
		break;
	case SynDereference::myTypeID:
		result = AnalyzeDereference(ctx, (SynDereference*)syntax);
		break;
	case SynTypeof::myTypeID:
		result = AnalyzeTypeof(ctx, (SynTypeof*)syntax);
		break;
	case SynIdentifier::myTypeID:
		result = AnalyzeVariableAccess(ctx, (SynIdentifier*)syntax);
		break;
	case SynTypeSimple::myTypeID:
		result = AnalyzeTypeSimple(ctx, (SynTypeSimple*)syntax);
		break;
	case SynSizeof::myTypeID:
		result = AnalyzeSizeof(ctx, (SynSizeof*)syntax);
		break;
	case SynConditional::myTypeID:
		result = AnalyzeConditional(ctx, (SynConditional*)syntax);
		break;
	case SynAssignment::myTypeID:
		result = AnalyzeAssignment(ctx, (SynAssignment*)syntax);
		break;
	case SynModifyAssignment::myTypeID:
		result = AnalyzeModifyAssignment(ctx, (SynModifyAssignment*)syntax);
		break;
	case SynMemberAccess::myTypeID:
		result = AnalyzeMemberAccess(ctx, (SynMemberAccess*)syntax);
		break;
	case SynTypeArray::myTypeID:
		result = AnalyzeTypeArray(ctx, (SynTypeArray*)syntax);
		break;
	case SynArrayIndex::myTypeID:
		result = AnalyzeArrayIndex(ctx, (SynArrayIndex*)syntax);
		break;
	case SynFunctionCall::myTypeID:
		result = AnalyzeFunctionCall(ctx, (SynFunctionCall*)syntax);
		break;
	case SynNew::myTypeID:
		result = AnalyzeNew(ctx, (SynNew*)syntax);
		break;
	case SynFunctionDefinition::myTypeID:
		result = AnalyzeFunctionDefinition(ctx, (SynFunctionDefinition*)syntax, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, true, true);
		break;
	case SynGenerator::myTypeID:
		result = AnalyzeGenerator(ctx, (SynGenerator*)syntax);
		break;
	case SynTypeReference::myTypeID:
		result = AnalyzeTypeReference(ctx, (SynTypeReference*)syntax);
		break;
	case SynTypeFunction::myTypeID:
		result = AnalyzeTypeFunction(ctx, (SynTypeFunction*)syntax);
		break;
	case SynTypeGenericInstance::myTypeID:
		result = AnalyzeTypeGenericInstance(ctx, (SynTypeGenericInstance*)syntax);
		break;
	case SynShortFunctionDefinition::myTypeID:
		result = AnalyzeShortFunctionDefinition(ctx, (SynShortFunctionDefinition*)syntax);
		break;
	case SynTypeAuto::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from auto type");
		break;
	case SynTypeAlias::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from generic type");
		break;
	case SynTypeGeneric::myTypeID:
		Stop(ctx, syntax, "ERROR: cannot take typeid from generic type");

		break;
	case SynError::myTypeID:
		result = AnalyzeError(ctx, (SynError*)syntax);
		break;
	default:
		break;
	}

	ctx.expressionDepth--;

	if(!result)
		Stop(ctx, syntax, "ERROR: unknown expression type");

	return result;
}